

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

int * vrna_idx_row_wise(uint length)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int *piVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  piVar3 = (int *)vrna_alloc(length * 4 + 4);
  auVar2 = _DAT_0012d020;
  auVar1 = _DAT_0012d010;
  if (length != 0) {
    uVar4 = length + 1;
    lVar5 = (ulong)uVar4 - 2;
    auVar7._8_4_ = (int)lVar5;
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar7 = auVar7 ^ _DAT_0012d020;
    do {
      auVar8._8_4_ = (int)uVar6;
      auVar8._0_8_ = uVar6;
      auVar8._12_4_ = (int)(uVar6 >> 0x20);
      auVar8 = (auVar8 | auVar1) ^ auVar2;
      if ((bool)(~(auVar8._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar8._0_4_ ||
                  auVar7._4_4_ < auVar8._4_4_) & 1)) {
        piVar3[uVar6 + 1] = ((length - 1) * length >> 1) + uVar4;
      }
      if ((auVar8._12_4_ != auVar7._12_4_ || auVar8._8_4_ <= auVar7._8_4_) &&
          auVar8._12_4_ <= auVar7._12_4_) {
        piVar3[uVar6 + 2] = ((length - 1) * (length - 2) >> 1) + uVar4;
      }
      uVar6 = uVar6 + 2;
      length = length - 2;
    } while ((uVar4 & 0xfffffffe) != uVar6);
  }
  return piVar3;
}

Assistant:

PUBLIC int *
vrna_idx_row_wise(unsigned int length)
{
  int i;
  int *idx = (int *)vrna_alloc(sizeof(int) * (length + 1));

  for (i = 1; i <= length; i++)
    idx[i] = (((length + 1 - i) * (length - i)) / 2) + length + 1;
  return idx;
}